

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::CrossLinkField
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  uint8_t uVar1;
  uint uVar2;
  Tables *pTVar3;
  size_t sVar4;
  long lVar5;
  size_type sVar6;
  FieldDescriptor FVar7;
  bool bVar8;
  int iVar9;
  const_iterator cVar10;
  const_iterator cVar11;
  Symbol SVar12;
  long *plVar13;
  undefined4 *puVar14;
  void *pvVar15;
  undefined8 *puVar16;
  void *__dest;
  SymbolBase *pSVar17;
  EnumDescriptor *pEVar18;
  EnumDescriptor *pEVar19;
  size_t sVar20;
  ErrorLocation location;
  PlaceholderType placeholder_type;
  size_type *psVar21;
  undefined1 *puVar22;
  byte bVar23;
  long lVar24;
  _Alloc_hider _Var25;
  char *pcVar26;
  _Base_ptr p_Var27;
  byte bVar28;
  char *pcVar29;
  size_type __dnew;
  undefined8 local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_270;
  uint local_260;
  string local_250;
  _Base_ptr local_230;
  string error_msg;
  string containing_type_name;
  size_type __dnew_1;
  int local_1e0;
  char local_1dc [4];
  undefined1 local_1d8 [32];
  char *local_1b8;
  undefined1 local_1b0 [48];
  SubstituteArg local_180;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  
  if (*(long *)(field + 0x38) == 0) {
    *(undefined1 **)(field + 0x38) = _FieldOptions_default_instance_;
  }
  FileDescriptorTables::AddFieldByStylizedNames(this->file_tables_,field);
  if (((proto->_has_bits_).has_bits_[0] & 2) != 0) {
    SVar12 = LookupSymbol(this,(string *)
                               ((ulong)(proto->extendee_).tagged_ptr_.ptr_ & 0xfffffffffffffffe),
                          (string *)(*(long *)(field + 8) + 0x20),PLACEHOLDER_EXTENDABLE_MESSAGE,
                          LOOKUP_ALL,true);
    if (SVar12.ptr_ == (SymbolBase *)0x0) {
LAB_0035a720:
      AddNotDefinedError(this,(string *)(*(long *)(field + 8) + 0x20),&proto->super_Message,EXTENDEE
                         ,(string *)
                          ((ulong)(proto->extendee_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      return;
    }
    if ((SVar12.ptr_)->symbol_type_ != '\x01') {
      if ((SVar12.ptr_)->symbol_type_ == '\0') goto LAB_0035a720;
      lVar24 = *(long *)(field + 8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__dnew_1,
                     "\"",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((ulong)(proto->extendee_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      plVar13 = (long *)std::__cxx11::string::append((char *)&__dnew_1);
      psVar21 = (size_type *)(plVar13 + 2);
      if ((size_type *)*plVar13 == psVar21) {
        aStack_270._M_allocated_capacity = *psVar21;
        aStack_270._8_8_ = plVar13[3];
        __dnew = (size_type)&aStack_270;
      }
      else {
        aStack_270._M_allocated_capacity = *psVar21;
        __dnew = (size_type)*plVar13;
      }
      local_278 = plVar13[1];
      *plVar13 = (long)psVar21;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      AddError(this,(string *)(lVar24 + 0x20),&proto->super_Message,EXTENDEE,(string *)&__dnew);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__dnew != &aStack_270) {
        operator_delete((void *)__dnew);
      }
      _Var25._M_p = (pointer)__dnew_1;
      if ((undefined1 *)__dnew_1 == local_1d8) {
        return;
      }
      goto LAB_0035b715;
    }
    *(SymbolBase **)(field + 0x20) = SVar12.ptr_;
    if (0 < (long)*(int *)(SVar12.ptr_ + 0x78)) {
      lVar24 = 0;
      do {
        if ((*(int *)(*(long *)(SVar12.ptr_ + 0x48) + lVar24) <= *(int *)(field + 4)) &&
           (*(int *)(field + 4) < *(int *)(*(long *)(SVar12.ptr_ + 0x48) + 4 + lVar24)))
        goto LAB_0035a5ab;
        lVar24 = lVar24 + 0x10;
      } while ((long)*(int *)(SVar12.ptr_ + 0x78) * 0x10 != lVar24);
    }
    if ((this->pool_->allow_unknown_ != true) ||
       (iVar9 = std::__cxx11::string::compare
                          ((char *)((ulong)(proto->extendee_).tagged_ptr_.ptr_ & 0xfffffffffffffffe)
                          ), iVar9 != 0)) {
      p_Var27 = *(_Base_ptr *)(field + 8);
      error_msg._M_dataplus._M_p = (pointer)&error_msg.field_2;
      __dnew = 0x30;
      error_msg._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&error_msg,(ulong)&__dnew);
      error_msg.field_2._M_allocated_capacity = __dnew;
      builtin_strncpy(error_msg._M_dataplus._M_p,
                      "\"$0\" does not declare $1 as an extension number.",0x30);
      error_msg._M_string_length = __dnew;
      error_msg._M_dataplus._M_p[__dnew] = '\0';
      __dnew = *(size_type *)(*(long *)(*(long *)(field + 0x20) + 8) + 0x20);
      local_278 = CONCAT44(local_278._4_4_,
                           *(undefined4 *)(*(long *)(*(long *)(field + 0x20) + 8) + 0x28));
      local_230 = p_Var27;
      __dnew_1 = (size_type)FastInt32ToBuffer(*(int32 *)(field + 4),local_1dc);
      sVar20 = strlen((char *)__dnew_1);
      local_1e0 = (int)sVar20;
      local_1b0._0_8_ = (char *)0x0;
      local_1b0._8_4_ = 0xffffffff;
      local_180.text_ = (char *)0x0;
      local_180.size_ = -1;
      local_60.text_ = (char *)0x0;
      local_60.size_ = -1;
      local_90.text_ = (char *)0x0;
      local_90.size_ = -1;
      local_c0.text_ = (char *)0x0;
      local_c0.size_ = -1;
      local_f0.text_ = (char *)0x0;
      local_f0.size_ = -1;
      local_120.text_ = (char *)0x0;
      local_120.size_ = -1;
      local_150.text_ = (char *)0x0;
      local_150.size_ = -1;
      strings::Substitute(&containing_type_name,&error_msg,(SubstituteArg *)&__dnew,
                          (SubstituteArg *)&__dnew_1,(SubstituteArg *)local_1b0,&local_180,&local_60
                          ,&local_90,&local_c0,&local_f0,&local_120,&local_150);
      AddError(this,(string *)(local_230 + 1),&proto->super_Message,NUMBER,&containing_type_name);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)containing_type_name._M_dataplus._M_p != &containing_type_name.field_2) {
        operator_delete(containing_type_name._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)error_msg._M_dataplus._M_p != &error_msg.field_2) {
        operator_delete(error_msg._M_dataplus._M_p);
      }
    }
  }
LAB_0035a5ab:
  if (((((byte)field[1] & 0x60) != 0x20) && (((byte)field[1] & 0x10) != 0)) &&
     (*(long *)(field + 0x28) != 0)) {
    AddError(this,(string *)(*(long *)(field + 8) + 0x20),&proto->super_Message,NAME,
             "Fields of oneofs must themselves have label LABEL_OPTIONAL.");
  }
  uVar2 = (proto->_has_bits_).has_bits_[0];
  if ((uVar2 & 4) == 0) {
    if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
      __dnew = (size_type)FieldDescriptor::TypeOnceInit;
      __dnew_1 = (size_type)field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&__dnew,
                 (FieldDescriptor **)&__dnew_1);
    }
    FVar7 = field[2];
    if (((byte)FVar7 & 0xfe) == 10) {
LAB_0035a652:
      lVar24 = *(long *)(field + 8);
      pcVar26 = "Field with message or enum type missing type_name.";
LAB_0035a661:
      location = TYPE;
      goto LAB_0035a66c;
    }
    if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
      __dnew = (size_type)FieldDescriptor::TypeOnceInit;
      __dnew_1 = (size_type)field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&__dnew,
                 (FieldDescriptor **)&__dnew_1);
      FVar7 = field[2];
    }
    if (FVar7 == (FieldDescriptor)0xe) goto LAB_0035a652;
  }
  else {
    placeholder_type = PLACEHOLDER_ENUM;
    if (proto->type_ != 0xe) {
      placeholder_type = uVar2 >> 3 & PLACEHOLDER_ENUM;
    }
    if (this->pool_->enforce_weak_ == false) {
      puVar22 = (undefined1 *)proto->options_;
      if ((FieldOptions *)puVar22 == (FieldOptions *)0x0) {
        puVar22 = _FieldOptions_default_instance_;
      }
      bVar23 = ((FieldOptions *)puVar22)->weak_;
    }
    else {
      bVar23 = 0;
    }
    bVar28 = (bVar23 ^ 1) & this->pool_->lazily_build_dependencies_;
    SVar12 = LookupSymbol(this,(string *)
                               ((ulong)(proto->type_name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe),
                          (string *)(*(long *)(field + 8) + 0x20),placeholder_type,LOOKUP_TYPES,
                          (bool)(bVar28 ^ 1));
    if ((SVar12.ptr_ == (SymbolBase *)0x0) || (uVar1 = (SVar12.ptr_)->symbol_type_, uVar1 == '\0'))
    {
      if (bVar28 != 0) {
        plVar13 = (long *)((ulong)(proto->type_name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
        __dnew = (size_type)&aStack_270;
        lVar24 = *plVar13;
        std::__cxx11::string::_M_construct<char*>((string *)&__dnew,lVar24,plVar13[1] + lVar24);
        puVar14 = (undefined4 *)
                  anon_unknown_1::TableArena::AllocRawInternal(&this->tables_->arena_,4,'\x11');
        sVar4 = local_278;
        sVar6 = __dnew;
        *puVar14 = 0;
        *(undefined4 **)(field + 0x18) = puVar14;
        pTVar3 = this->tables_;
        if ((long)local_278 < 0) {
          stringpiece_internal::StringPiece::LogFatalSizeTooBig
                    (local_278,"string length exceeds max size");
        }
        pvVar15 = DescriptorPool::Tables::AllocateBytes(pTVar3,(int)sVar4 + 1);
        memcpy(pvVar15,(void *)sVar6,sVar4);
        *(undefined1 *)((long)pvVar15 + sVar4) = 0;
        *(void **)(field + 0x30) = pvVar15;
        if (((proto->_has_bits_).has_bits_[0] & 8) == 0) {
          __dest = (void *)0x0;
        }
        else {
          pTVar3 = this->tables_;
          puVar16 = (undefined8 *)
                    ((ulong)(proto->default_value_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
          pvVar15 = (void *)*puVar16;
          sVar4 = puVar16[1];
          if ((long)sVar4 < 0) {
            stringpiece_internal::StringPiece::LogFatalSizeTooBig
                      (sVar4,"string length exceeds max size");
          }
          __dest = DescriptorPool::Tables::AllocateBytes(pTVar3,(int)sVar4 + 1);
          memcpy(__dest,pvVar15,sVar4);
          *(undefined1 *)((long)__dest + sVar4) = 0;
        }
        *(void **)(field + 0x40) = __dest;
        FileDescriptorTables::AddFieldByNumber(this->file_tables_,field);
        if (((byte)field[1] & 8) != 0) {
          DescriptorPool::Tables::AddExtension(this->tables_,field);
        }
        _Var25._M_p = (pointer)__dnew;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__dnew == &aStack_270) {
          return;
        }
        goto LAB_0035b715;
      }
      if (bVar23 != 0) {
        __dnew_1 = 0x15;
        __dnew = (size_type)&aStack_270;
        __dnew = std::__cxx11::string::_M_create(&__dnew,(ulong)&__dnew_1);
        aStack_270._M_allocated_capacity = __dnew_1;
        builtin_strncpy((char *)__dnew,"google.protobuf.Empty",0x15);
        local_278 = __dnew_1;
        *(char *)(__dnew + __dnew_1) = '\0';
        SVar12 = FindSymbol(this,(string *)&__dnew,true);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__dnew != &aStack_270) {
          operator_delete((void *)__dnew);
        }
      }
      if ((SVar12.ptr_ == (SymbolBase *)0x0) || (uVar1 = (SVar12.ptr_)->symbol_type_, uVar1 == '\0')
         ) {
        AddNotDefinedError(this,(string *)(*(long *)(field + 8) + 0x20),&proto->super_Message,TYPE,
                           (string *)
                           ((ulong)(proto->type_name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
        return;
      }
    }
    if (((proto->_has_bits_).has_bits_[0] & 0x400) == 0) {
      if (uVar1 == '\x01') {
        FVar7 = (FieldDescriptor)0xb;
      }
      else {
        if (uVar1 != '\x04') {
          lVar24 = *(long *)(field + 8);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &__dnew_1,"\"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((ulong)(proto->type_name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
          puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&__dnew_1);
          psVar21 = puVar16 + 2;
          if ((size_type *)*puVar16 == psVar21) {
            aStack_270._M_allocated_capacity = *psVar21;
            aStack_270._8_8_ = puVar16[3];
            __dnew = (size_type)&aStack_270;
          }
          else {
            aStack_270._M_allocated_capacity = *psVar21;
            __dnew = (size_type)*puVar16;
          }
          local_278 = puVar16[1];
          *puVar16 = psVar21;
          puVar16[1] = 0;
          *(undefined1 *)(puVar16 + 2) = 0;
          AddError(this,(string *)(lVar24 + 0x20),&proto->super_Message,TYPE,(string *)&__dnew);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__dnew != &aStack_270) {
            operator_delete((void *)__dnew);
          }
          _Var25._M_p = (pointer)__dnew_1;
          if ((undefined1 *)__dnew_1 == local_1d8) {
            return;
          }
          goto LAB_0035b715;
        }
        FVar7 = (FieldDescriptor)0xe;
      }
      field[2] = FVar7;
    }
    if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
      __dnew = (size_type)FieldDescriptor::TypeOnceInit;
      __dnew_1 = (size_type)field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&__dnew,
                 (FieldDescriptor **)&__dnew_1);
    }
    FVar7 = field[2];
    if (((byte)FVar7 & 0xfe) != 10) {
      if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
        __dnew = (size_type)FieldDescriptor::TypeOnceInit;
        __dnew_1 = (size_type)field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&__dnew,
                   (FieldDescriptor **)&__dnew_1);
        FVar7 = field[2];
      }
      if (FVar7 == (FieldDescriptor)0xe) {
        bVar8 = (SVar12.ptr_)->symbol_type_ != '\x04';
        pSVar17 = (SymbolBase *)0x0;
        if (!bVar8) {
          pSVar17 = SVar12.ptr_;
        }
        *(SymbolBase **)(field + 0x30) = pSVar17;
        if (bVar8) {
          lVar24 = *(long *)(field + 8);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &__dnew_1,"\"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((ulong)(proto->type_name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
          puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&__dnew_1);
          psVar21 = puVar16 + 2;
          if ((size_type *)*puVar16 == psVar21) {
            aStack_270._M_allocated_capacity = *psVar21;
            aStack_270._8_8_ = puVar16[3];
            __dnew = (size_type)&aStack_270;
          }
          else {
            aStack_270._M_allocated_capacity = *psVar21;
            __dnew = (size_type)*puVar16;
          }
          local_278 = puVar16[1];
          *puVar16 = psVar21;
          puVar16[1] = 0;
          *(undefined1 *)(puVar16 + 2) = 0;
          AddError(this,(string *)(lVar24 + 0x20),&proto->super_Message,TYPE,(string *)&__dnew);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__dnew != &aStack_270) {
            operator_delete((void *)__dnew);
          }
          _Var25._M_p = (pointer)__dnew_1;
          if ((undefined1 *)__dnew_1 == local_1d8) {
            return;
          }
          goto LAB_0035b715;
        }
        pEVar18 = FieldDescriptor::enum_type(field);
        FVar7 = field[1];
        if (((byte)pEVar18[1] & 1) != 0) {
          FVar7 = (FieldDescriptor)((byte)FVar7 & 0xfe);
          field[1] = FVar7;
        }
        if (((byte)FVar7 & 1) == 0) {
          pEVar18 = FieldDescriptor::enum_type(field);
          if (0 < *(int *)(pEVar18 + 4)) {
            pEVar18 = FieldDescriptor::enum_type(field);
            *(undefined8 *)(field + 0x40) = *(undefined8 *)(pEVar18 + 0x28);
          }
          goto LAB_0035a671;
        }
        bVar8 = io::Tokenizer::IsIdentifier
                          ((string *)
                           ((ulong)(proto->default_value_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
        if (!bVar8) {
          lVar24 = *(long *)(field + 8);
          pcVar26 = "Default value for an enum field must be an identifier.";
          goto LAB_0035b12e;
        }
        pvVar15 = (proto->default_value_).tagged_ptr_.ptr_;
        pEVar18 = FieldDescriptor::enum_type(field);
        SVar12 = LookupSymbolNoPlaceholder
                           (this,(string *)((ulong)pvVar15 & 0xfffffffffffffffe),
                            (string *)(*(long *)(pEVar18 + 8) + 0x20),LOOKUP_ALL,true);
        if (SVar12.ptr_ != (SymbolBase *)0x0) {
          if ((SVar12.ptr_)->symbol_type_ != '\x05') {
            if ((SVar12.ptr_)->symbol_type_ != '\x06') goto LAB_0035b214;
            SVar12.ptr_ = SVar12.ptr_ + -1;
          }
          pEVar18 = *(EnumDescriptor **)(SVar12.ptr_ + 0x10);
          pEVar19 = FieldDescriptor::enum_type(field);
          if (pEVar18 == pEVar19) {
            *(SymbolBase **)(field + 0x40) = SVar12.ptr_;
            goto LAB_0035a671;
          }
        }
LAB_0035b214:
        lVar24 = *(long *)(field + 8);
        pEVar18 = FieldDescriptor::enum_type(field);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_180,"Enum type \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (*(long *)(pEVar18 + 8) + 0x20));
        plVar13 = (long *)std::__cxx11::string::append((char *)&local_180);
        psVar21 = (size_type *)(plVar13 + 2);
        if ((size_type *)*plVar13 == psVar21) {
          local_1b0._16_8_ = *psVar21;
          local_1b0._24_8_ = plVar13[3];
          local_1b0._0_8_ = local_1b0 + 0x10;
        }
        else {
          local_1b0._16_8_ = *psVar21;
          local_1b0._0_8_ = (size_type *)*plVar13;
        }
        local_1b0._8_8_ = plVar13[1];
        *plVar13 = (long)psVar21;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &__dnew_1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1b0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((ulong)(proto->default_value_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&__dnew_1);
        psVar21 = puVar16 + 2;
        if ((size_type *)*puVar16 == psVar21) {
          aStack_270._M_allocated_capacity = *psVar21;
          aStack_270._8_8_ = puVar16[3];
          __dnew = (size_type)&aStack_270;
        }
        else {
          aStack_270._M_allocated_capacity = *psVar21;
          __dnew = (size_type)*puVar16;
        }
        local_278 = puVar16[1];
        *puVar16 = psVar21;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        AddError(this,(string *)(lVar24 + 0x20),&proto->super_Message,DEFAULT_VALUE,
                 (string *)&__dnew);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__dnew != &aStack_270) {
          operator_delete((void *)__dnew);
        }
        if ((undefined1 *)__dnew_1 != local_1d8) {
          operator_delete((void *)__dnew_1);
        }
        if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
          operator_delete((void *)local_1b0._0_8_);
        }
        if (local_180.text_ != local_180.scratch_ + 4) {
          operator_delete(local_180.text_);
        }
        goto LAB_0035a671;
      }
      lVar24 = *(long *)(field + 8);
      pcVar26 = "Field with primitive type has type_name.";
      goto LAB_0035a661;
    }
    bVar8 = (SVar12.ptr_)->symbol_type_ != '\x01';
    pSVar17 = (SymbolBase *)0x0;
    if (!bVar8) {
      pSVar17 = SVar12.ptr_;
    }
    *(SymbolBase **)(field + 0x30) = pSVar17;
    if (bVar8) {
      lVar24 = *(long *)(field + 8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__dnew_1,
                     "\"",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((ulong)(proto->type_name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&__dnew_1);
      psVar21 = puVar16 + 2;
      if ((size_type *)*puVar16 == psVar21) {
        aStack_270._M_allocated_capacity = *psVar21;
        aStack_270._8_8_ = puVar16[3];
        __dnew = (size_type)&aStack_270;
      }
      else {
        aStack_270._M_allocated_capacity = *psVar21;
        __dnew = (size_type)*puVar16;
      }
      local_278 = puVar16[1];
      *puVar16 = psVar21;
      puVar16[1] = 0;
      *(undefined1 *)(puVar16 + 2) = 0;
      AddError(this,(string *)(lVar24 + 0x20),&proto->super_Message,TYPE,(string *)&__dnew);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__dnew != &aStack_270) {
        operator_delete((void *)__dnew);
      }
      _Var25._M_p = (pointer)__dnew_1;
      if ((undefined1 *)__dnew_1 == local_1d8) {
        return;
      }
      goto LAB_0035b715;
    }
    if (((byte)field[1] & 1) == 0) goto LAB_0035a671;
    lVar24 = *(long *)(field + 8);
    pcVar26 = "Messages can\'t have default values.";
LAB_0035b12e:
    location = DEFAULT_VALUE;
LAB_0035a66c:
    AddError(this,(string *)(lVar24 + 0x20),&proto->super_Message,location,pcVar26);
  }
LAB_0035a671:
  bVar8 = FileDescriptorTables::AddFieldByNumber(this->file_tables_,field);
  if (bVar8) {
    if (((byte)field[1] & 8) == 0) {
      return;
    }
    bVar8 = DescriptorPool::Tables::AddExtension(this->tables_,field);
    if (bVar8) {
      return;
    }
    pTVar3 = this->tables_;
    __dnew = *(size_type *)(field + 0x20);
    local_278 = CONCAT44(local_278._4_4_,*(int *)(field + 4));
    cVar10 = std::
             _Rb_tree<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>,_std::_Select1st<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
             ::find(&(pTVar3->extensions_)._M_t,(key_type *)&__dnew);
    if ((_Rb_tree_header *)cVar10._M_node ==
        &(pTVar3->extensions_)._M_t._M_impl.super__Rb_tree_header) {
      p_Var27 = (_Base_ptr)0x0;
    }
    else {
      p_Var27 = cVar10._M_node[1]._M_left;
    }
    if (*(long *)(field + 0x20) == 0) {
      containing_type_name._M_dataplus._M_p = (pointer)&containing_type_name.field_2;
      containing_type_name.field_2._M_allocated_capacity._0_4_ = 0x6e6b6e75;
      containing_type_name.field_2._M_allocated_capacity._4_3_ = 0x6e776f;
      containing_type_name._M_string_length = 7;
      containing_type_name.field_2._M_local_buf[7] = '\0';
    }
    else {
      lVar24 = *(long *)(*(long *)(field + 0x20) + 8);
      containing_type_name._M_dataplus._M_p = (pointer)&containing_type_name.field_2;
      lVar5 = *(long *)(lVar24 + 0x20);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&containing_type_name,lVar5,*(long *)(lVar24 + 0x28) + lVar5);
    }
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    __dnew = 0x52;
    local_230 = p_Var27;
    pcVar26 = (char *)std::__cxx11::string::_M_create((ulong *)&local_250,(ulong)&__dnew);
    sVar6 = __dnew;
    local_250.field_2._M_allocated_capacity = __dnew;
    local_250._M_dataplus._M_p = pcVar26;
    memcpy(pcVar26,
           "Extension number $0 has already been used in \"$1\" by extension \"$2\" defined in $3.",
           0x52);
    local_250._M_string_length = sVar6;
    pcVar26[sVar6] = '\0';
    __dnew = (size_type)FastInt32ToBuffer(*(int32 *)(field + 4),(char *)((long)&local_278 + 4));
    sVar20 = strlen((char *)__dnew);
    local_278 = CONCAT44(local_278._4_4_,(int)sVar20);
    __dnew_1 = (size_type)containing_type_name._M_dataplus._M_p;
    local_1e0 = (int)containing_type_name._M_string_length;
    local_1b0._0_8_ = *(undefined8 *)(local_230->_M_parent + 1);
    local_1b0._8_4_ = *(undefined4 *)&local_230->_M_parent[1]._M_parent;
    local_180.text_ = (char *)**(undefined8 **)local_230->_M_left;
    local_180.size_ = *(int *)(*(undefined8 **)local_230->_M_left + 1);
    local_60.text_ = (char *)0x0;
    local_60.size_ = -1;
    local_90.text_ = (char *)0x0;
    local_90.size_ = -1;
    local_c0.text_ = (char *)0x0;
    local_c0.size_ = -1;
    local_f0.text_ = (char *)0x0;
    local_f0.size_ = -1;
    local_120.text_ = (char *)0x0;
    local_120.size_ = -1;
    local_150.text_ = (char *)0x0;
    local_150.size_ = -1;
    strings::Substitute(&error_msg,&local_250,(SubstituteArg *)&__dnew,(SubstituteArg *)&__dnew_1,
                        (SubstituteArg *)local_1b0,&local_180,&local_60,&local_90,&local_c0,
                        &local_f0,&local_120,&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p);
    }
    AddWarning(this,(string *)(*(long *)(field + 8) + 0x20),&proto->super_Message,NUMBER,&error_msg)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)error_msg._M_dataplus._M_p != &error_msg.field_2) {
      operator_delete(error_msg._M_dataplus._M_p);
    }
    _Var25._M_p = containing_type_name._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)containing_type_name._M_dataplus._M_p == &containing_type_name.field_2) {
      return;
    }
    goto LAB_0035b715;
  }
  lVar24 = *(long *)(field + 0x20);
  uVar2 = *(uint *)(field + 4);
  if ((lVar24 == 0 || (long)(int)uVar2 < 1) || (*(ushort *)(lVar24 + 2) < uVar2)) {
    __dnew_1 = (size_type)&__dnew;
    local_278 = 0;
    aStack_270._M_allocated_capacity = 0;
    __dnew = CONCAT71(__dnew._1_7_,10);
    aStack_270._8_8_ = lVar24;
    local_260 = uVar2;
    cVar11 = std::
             unordered_set<google::protobuf::Symbol,_google::protobuf::(anonymous_namespace)::FieldsByNumberHash,_google::protobuf::(anonymous_namespace)::FieldsByNumberEq,_std::allocator<google::protobuf::Symbol>_>
             ::find(&this->file_tables_->fields_by_number_,(key_type *)&__dnew_1);
    if ((cVar11.super__Node_iterator_base<google::protobuf::Symbol,_true>._M_cur ==
         (__node_type *)0x0) ||
       (pcVar26 = *(char **)((long)cVar11.super__Node_iterator_base<google::protobuf::Symbol,_true>.
                                   _M_cur + 8), pcVar26 == (char *)0x0)) {
      pcVar29 = (char *)0x0;
    }
    else {
      pcVar29 = (char *)0x0;
      if (*pcVar26 == '\x02') {
        pcVar29 = pcVar26;
      }
    }
    lVar24 = *(long *)(field + 0x20);
    if (lVar24 != 0) goto LAB_0035ac6d;
    containing_type_name._M_dataplus._M_p = (pointer)&containing_type_name.field_2;
    containing_type_name.field_2._M_allocated_capacity._0_4_ = 0x6e6b6e75;
    containing_type_name.field_2._M_allocated_capacity._4_3_ = 0x6e776f;
    containing_type_name._M_string_length = 7;
    containing_type_name.field_2._M_local_buf[7] = '\0';
  }
  else {
    pcVar29 = (char *)(*(long *)(lVar24 + 0x28) + (long)(int)uVar2 * 0x48 + -0x48);
LAB_0035ac6d:
    containing_type_name._M_dataplus._M_p = (pointer)&containing_type_name.field_2;
    lVar5 = *(long *)(*(long *)(lVar24 + 8) + 0x20);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&containing_type_name,lVar5,*(long *)(*(long *)(lVar24 + 8) + 0x28) + lVar5
              );
  }
  local_230 = (_Base_ptr)(*(long *)(field + 8) + 0x20);
  if (((byte)field[1] & 8) == 0) {
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    __dnew = 0x3c;
    local_250._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_250,(ulong)&__dnew);
    local_250.field_2._M_allocated_capacity = __dnew;
    builtin_strncpy(local_250._M_dataplus._M_p,
                    "Field number $0 has already been used in \"$1\" by field \"$2\".",0x3c);
    local_250._M_string_length = __dnew;
    local_250._M_dataplus._M_p[__dnew] = '\0';
    __dnew = (size_type)FastInt32ToBuffer(*(int32 *)(field + 4),(char *)((long)&local_278 + 4));
    sVar20 = strlen((char *)__dnew);
    local_278 = CONCAT44(local_278._4_4_,(int)sVar20);
    __dnew_1 = (size_type)containing_type_name._M_dataplus._M_p;
    local_1e0 = (int)containing_type_name._M_string_length;
    local_1b0._0_8_ = **(undefined8 **)(pcVar29 + 8);
    local_1b0._8_4_ = *(undefined4 *)(*(undefined8 **)(pcVar29 + 8) + 1);
    local_180.text_ = (char *)0x0;
    local_180.size_ = -1;
    local_60.text_ = (char *)0x0;
    local_60.size_ = -1;
    local_90.text_ = (char *)0x0;
    local_90.size_ = -1;
    local_c0.text_ = (char *)0x0;
    local_c0.size_ = -1;
    local_f0.text_ = (char *)0x0;
    local_f0.size_ = -1;
    local_120.text_ = (char *)0x0;
    local_120.size_ = -1;
    local_150.text_ = (char *)0x0;
    local_150.size_ = -1;
    strings::Substitute(&error_msg,&local_250,(SubstituteArg *)&__dnew,(SubstituteArg *)&__dnew_1,
                        (SubstituteArg *)local_1b0,&local_180,&local_60,&local_90,&local_c0,
                        &local_f0,&local_120,&local_150);
    AddError(this,(string *)local_230,&proto->super_Message,NUMBER,&error_msg);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)error_msg._M_dataplus._M_p != &error_msg.field_2) {
      operator_delete(error_msg._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
LAB_0035afca:
      operator_delete(local_250._M_dataplus._M_p);
    }
  }
  else {
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    __dnew = 0x44;
    local_1b8 = pcVar29;
    pcVar26 = (char *)std::__cxx11::string::_M_create((ulong *)&local_250,(ulong)&__dnew);
    sVar6 = __dnew;
    local_250.field_2._M_allocated_capacity = __dnew;
    local_250._M_dataplus._M_p = pcVar26;
    memcpy(pcVar26,"Extension number $0 has already been used in \"$1\" by extension \"$2\".",0x44);
    local_250._M_string_length = sVar6;
    pcVar26[sVar6] = '\0';
    __dnew = (size_type)FastInt32ToBuffer(*(int32 *)(field + 4),(char *)((long)&local_278 + 4));
    sVar20 = strlen((char *)__dnew);
    local_278 = CONCAT44(local_278._4_4_,(int)sVar20);
    __dnew_1 = (size_type)containing_type_name._M_dataplus._M_p;
    local_1e0 = (int)containing_type_name._M_string_length;
    local_1b0._0_8_ = *(undefined8 *)(*(long *)(local_1b8 + 8) + 0x20);
    local_1b0._8_4_ = *(undefined4 *)(*(long *)(local_1b8 + 8) + 0x28);
    local_180.text_ = (char *)0x0;
    local_180.size_ = -1;
    local_60.text_ = (char *)0x0;
    local_60.size_ = -1;
    local_90.text_ = (char *)0x0;
    local_90.size_ = -1;
    local_c0.text_ = (char *)0x0;
    local_c0.size_ = -1;
    local_f0.text_ = (char *)0x0;
    local_f0.size_ = -1;
    local_120.text_ = (char *)0x0;
    local_120.size_ = -1;
    local_150.text_ = (char *)0x0;
    local_150.size_ = -1;
    strings::Substitute(&error_msg,&local_250,(SubstituteArg *)&__dnew,(SubstituteArg *)&__dnew_1,
                        (SubstituteArg *)local_1b0,&local_180,&local_60,&local_90,&local_c0,
                        &local_f0,&local_120,&local_150);
    AddError(this,(string *)local_230,&proto->super_Message,NUMBER,&error_msg);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)error_msg._M_dataplus._M_p != &error_msg.field_2) {
      operator_delete(error_msg._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) goto LAB_0035afca;
  }
  _Var25._M_p = containing_type_name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)containing_type_name._M_dataplus._M_p == &containing_type_name.field_2) {
    return;
  }
LAB_0035b715:
  operator_delete(_Var25._M_p);
  return;
}

Assistant:

void DescriptorBuilder::CrossLinkField(FieldDescriptor* field,
                                       const FieldDescriptorProto& proto) {
  if (field->options_ == nullptr) {
    field->options_ = &FieldOptions::default_instance();
  }

  // Add the field to the lowercase-name and camelcase-name tables.
  file_tables_->AddFieldByStylizedNames(field);

  if (proto.has_extendee()) {
    Symbol extendee =
        LookupSymbol(proto.extendee(), field->full_name(),
                     DescriptorPool::PLACEHOLDER_EXTENDABLE_MESSAGE);
    if (extendee.IsNull()) {
      AddNotDefinedError(field->full_name(), proto,
                         DescriptorPool::ErrorCollector::EXTENDEE,
                         proto.extendee());
      return;
    } else if (extendee.type() != Symbol::MESSAGE) {
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::EXTENDEE,
               "\"" + proto.extendee() + "\" is not a message type.");
      return;
    }
    field->containing_type_ = extendee.descriptor();

    const Descriptor::ExtensionRange* extension_range =
        field->containing_type()->FindExtensionRangeContainingNumber(
            field->number());

    if (extension_range == nullptr) {
      // Set of valid extension numbers for MessageSet is different (< 2^32)
      // from other extendees (< 2^29). If unknown deps are allowed, we may not
      // have that information, and wrongly deem the extension as invalid.
      auto skip_check = get_allow_unknown(pool_) &&
                        proto.extendee() == "google.protobuf.bridge.MessageSet";
      if (!skip_check) {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::NUMBER,
                 strings::Substitute("\"$0\" does not declare $1 as an "
                                  "extension number.",
                                  field->containing_type()->full_name(),
                                  field->number()));
      }
    }
  }

  if (field->containing_oneof() != nullptr) {
    if (field->label() != FieldDescriptor::LABEL_OPTIONAL) {
      // Note that this error will never happen when parsing .proto files.
      // It can only happen if you manually construct a FileDescriptorProto
      // that is incorrect.
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::NAME,
               "Fields of oneofs must themselves have label LABEL_OPTIONAL.");
    }
  }

  if (proto.has_type_name()) {
    // Assume we are expecting a message type unless the proto contains some
    // evidence that it expects an enum type.  This only makes a difference if
    // we end up creating a placeholder.
    bool expecting_enum = (proto.type() == FieldDescriptorProto::TYPE_ENUM) ||
                          proto.has_default_value();

    // In case of weak fields we force building the dependency. We need to know
    // if the type exist or not. If it doesn't exist we substitute Empty which
    // should only be done if the type can't be found in the generated pool.
    // TODO(gerbens) Ideally we should query the database directly to check
    // if weak fields exist or not so that we don't need to force building
    // weak dependencies. However the name lookup rules for symbols are
    // somewhat complicated, so I defer it too another CL.
    bool is_weak = !pool_->enforce_weak_ && proto.options().weak();
    bool is_lazy = pool_->lazily_build_dependencies_ && !is_weak;

    Symbol type =
        LookupSymbol(proto.type_name(), field->full_name(),
                     expecting_enum ? DescriptorPool::PLACEHOLDER_ENUM
                                    : DescriptorPool::PLACEHOLDER_MESSAGE,
                     LOOKUP_TYPES, !is_lazy);

    if (type.IsNull()) {
      if (is_lazy) {
        // Save the symbol names for later for lookup, and allocate the once
        // object needed for the accessors.
        std::string name = proto.type_name();
        field->type_once_ = tables_->Create<internal::once_flag>();
        field->type_descriptor_.lazy_type_name = tables_->Strdup(name);
        field->lazy_default_value_enum_name_ =
            proto.has_default_value() ? tables_->Strdup(proto.default_value())
                                      : nullptr;

        // AddFieldByNumber and AddExtension are done later in this function,
        // and can/must be done if the field type was not found. The related
        // error checking is not necessary when in lazily_build_dependencies_
        // mode, and can't be done without building the type's descriptor,
        // which we don't want to do.
        file_tables_->AddFieldByNumber(field);
        if (field->is_extension()) {
          tables_->AddExtension(field);
        }
        return;
      } else {
        // If the type is a weak type, we change the type to a google.protobuf.Empty
        // field.
        if (is_weak) {
          type = FindSymbol(kNonLinkedWeakMessageReplacementName);
        }
        if (type.IsNull()) {
          AddNotDefinedError(field->full_name(), proto,
                             DescriptorPool::ErrorCollector::TYPE,
                             proto.type_name());
          return;
        }
      }
    }

    if (!proto.has_type()) {
      // Choose field type based on symbol.
      if (type.type() == Symbol::MESSAGE) {
        field->type_ = FieldDescriptor::TYPE_MESSAGE;
      } else if (type.type() == Symbol::ENUM) {
        field->type_ = FieldDescriptor::TYPE_ENUM;
      } else {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE,
                 "\"" + proto.type_name() + "\" is not a type.");
        return;
      }
    }

    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      field->type_descriptor_.message_type = type.descriptor();
      if (field->type_descriptor_.message_type == nullptr) {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE,
                 "\"" + proto.type_name() + "\" is not a message type.");
        return;
      }

      if (field->has_default_value()) {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                 "Messages can't have default values.");
      }
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      field->type_descriptor_.enum_type = type.enum_descriptor();
      if (field->type_descriptor_.enum_type == nullptr) {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE,
                 "\"" + proto.type_name() + "\" is not an enum type.");
        return;
      }

      if (field->enum_type()->is_placeholder_) {
        // We can't look up default values for placeholder types.  We'll have
        // to just drop them.
        field->has_default_value_ = false;
      }

      if (field->has_default_value()) {
        // Ensure that the default value is an identifier. Parser cannot always
        // verify this because it does not have complete type information.
        // N.B. that this check yields better error messages but is not
        // necessary for correctness (an enum symbol must be a valid identifier
        // anyway), only for better errors.
        if (!io::Tokenizer::IsIdentifier(proto.default_value())) {
          AddError(field->full_name(), proto,
                   DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                   "Default value for an enum field must be an identifier.");
        } else {
          // We can't just use field->enum_type()->FindValueByName() here
          // because that locks the pool's mutex, which we have already locked
          // at this point.
          const EnumValueDescriptor* default_value =
              LookupSymbolNoPlaceholder(proto.default_value(),
                                        field->enum_type()->full_name())
                  .enum_value_descriptor();

          if (default_value != nullptr &&
              default_value->type() == field->enum_type()) {
            field->default_value_enum_ = default_value;
          } else {
            AddError(field->full_name(), proto,
                     DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                     "Enum type \"" + field->enum_type()->full_name() +
                         "\" has no value named \"" + proto.default_value() +
                         "\".");
          }
        }
      } else if (field->enum_type()->value_count() > 0) {
        // All enums must have at least one value, or we would have reported
        // an error elsewhere.  We use the first defined value as the default
        // if a default is not explicitly defined.
        field->default_value_enum_ = field->enum_type()->value(0);
      }
    } else {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "Field with primitive type has type_name.");
    }
  } else {
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE ||
        field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "Field with message or enum type missing type_name.");
    }
  }

  // Add the field to the fields-by-number table.
  // Note:  We have to do this *after* cross-linking because extensions do not
  // know their containing type until now. If we're in
  // lazily_build_dependencies_ mode, we're guaranteed there's no errors, so no
  // risk to calling containing_type() or other accessors that will build
  // dependencies.
  if (!file_tables_->AddFieldByNumber(field)) {
    const FieldDescriptor* conflicting_field = file_tables_->FindFieldByNumber(
        field->containing_type(), field->number());
    std::string containing_type_name =
        field->containing_type() == nullptr
            ? "unknown"
            : field->containing_type()->full_name();
    if (field->is_extension()) {
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::NUMBER,
               strings::Substitute("Extension number $0 has already been used "
                                "in \"$1\" by extension \"$2\".",
                                field->number(), containing_type_name,
                                conflicting_field->full_name()));
    } else {
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::NUMBER,
               strings::Substitute("Field number $0 has already been used in "
                                "\"$1\" by field \"$2\".",
                                field->number(), containing_type_name,
                                conflicting_field->name()));
    }
  } else {
    if (field->is_extension()) {
      if (!tables_->AddExtension(field)) {
        const FieldDescriptor* conflicting_field =
            tables_->FindExtension(field->containing_type(), field->number());
        std::string containing_type_name =
            field->containing_type() == nullptr
                ? "unknown"
                : field->containing_type()->full_name();
        std::string error_msg = strings::Substitute(
            "Extension number $0 has already been used in \"$1\" by extension "
            "\"$2\" defined in $3.",
            field->number(), containing_type_name,
            conflicting_field->full_name(), conflicting_field->file()->name());
        // Conflicting extension numbers should be an error. However, before
        // turning this into an error we need to fix all existing broken
        // protos first.
        // TODO(xiaofeng): Change this to an error.
        AddWarning(field->full_name(), proto,
                   DescriptorPool::ErrorCollector::NUMBER, error_msg);
      }
    }
  }
}